

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# doctest.h
# Opt level: O0

String * __thiscall
doctest::detail::stringifyBinaryExpr<std::tuple<int,int,int>,std::tuple<int,int,int>>
          (String *__return_storage_ptr__,detail *this,tuple<int,_int,_int> *lhs,char *op,
          tuple<int,_int,_int> *rhs)

{
  String local_98;
  String local_70;
  String local_58;
  String local_40;
  tuple<int,_int,_int> *local_28;
  tuple<int,_int,_int> *rhs_local;
  char *op_local;
  tuple<int,_int,_int> *lhs_local;
  
  local_28 = (tuple<int,_int,_int> *)op;
  rhs_local = lhs;
  op_local = (char *)this;
  lhs_local = (tuple<int,_int,_int> *)__return_storage_ptr__;
  toString<std::tuple<int,_int,_int>,_true>(&local_58,(tuple<int,_int,_int> *)this);
  String::String(&local_70,(char *)rhs_local);
  doctest::operator+(&local_40,&local_58,&local_70);
  toString<std::tuple<int,_int,_int>,_true>(&local_98,local_28);
  doctest::operator+(__return_storage_ptr__,&local_40,&local_98);
  String::~String(&local_98);
  String::~String(&local_40);
  String::~String(&local_70);
  String::~String(&local_58);
  return __return_storage_ptr__;
}

Assistant:

String stringifyBinaryExpr(const DOCTEST_REF_WRAP(L) lhs, const char* op,
                               const DOCTEST_REF_WRAP(R) rhs) {
        return (DOCTEST_STRINGIFY(lhs)) + op + (DOCTEST_STRINGIFY(rhs));
    }